

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O2

bool __thiscall aiMetadata::Set<aiString>(aiMetadata *this,uint index,string *key,aiString *value)

{
  aiString *paVar1;
  ulong __n;
  aiString *paVar2;
  uint uVar3;
  bool bVar4;
  uint *puVar5;
  
  if (index < this->mNumProperties) {
    __n = key->_M_string_length;
    if (__n == 0) {
      bVar4 = false;
    }
    else {
      if (__n < 0x400) {
        paVar2 = this->mKeys;
        paVar1 = paVar2 + index;
        paVar1->length = (ai_uint32)__n;
        memcpy(paVar1->data,(key->_M_dataplus)._M_p,__n);
        paVar2[index].data[__n] = '\0';
      }
      this->mValues[index].mType = AI_AISTRING;
      puVar5 = (uint *)operator_new(0x404);
      uVar3 = 0x3ff;
      if (value->length < 0x3ff) {
        uVar3 = value->length;
      }
      *puVar5 = uVar3;
      memcpy(puVar5 + 1,value->data,(ulong)uVar3);
      *(undefined1 *)((long)puVar5 + (ulong)uVar3 + 4) = 0;
      this->mValues[index].mData = puVar5;
      bVar4 = true;
    }
    return bVar4;
  }
  return false;
}

Assistant:

inline 
    bool Set( unsigned index, const std::string& key, const T& value ) {
        // In range assertion
        if ( index >= mNumProperties ) {
            return false;
        }

        // Ensure that we have a valid key.
        if ( key.empty() ) {
            return false;
        }

        // Set metadata key
        mKeys[index] = key;

        // Set metadata type
        mValues[index].mType = GetAiType(value);
        // Copy the given value to the dynamic storage
        mValues[index].mData = new T(value);

        return true;
    }